

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O3

_Bool compare_intersections(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  roaring_bitmap_t *x2;
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *prVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  _Bool _Var6;
  
  if (1 < count) {
    uVar4 = 2;
    _Var6 = false;
    do {
      bitmap1 = roaring_bitmap_and(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      _Var1 = is_intersection_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no run intersection incorrect";
LAB_001032df:
        puts(pcVar5 + 10);
        return _Var6;
      }
      _Var1 = is_intersect_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no run intersect incorrect";
        goto LAB_001032df;
      }
      prVar2 = roaring_bitmap_and(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      _Var1 = is_intersection_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "runs intersection incorrect";
LAB_00103335:
        puts(pcVar5);
        return _Var6;
      }
      _Var1 = is_intersect_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "runs intersect incorrect";
        goto LAB_00103335;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Intersections don\'t agree! (slow) ";
        goto LAB_00103335;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Intersections don\'t agree!";
LAB_0010335a:
        puts(pcVar5);
        puts("\n\nbitmap1:");
        roaring_bitmap_printf_describe(bitmap1);
        puts("\n\nbitmap2:");
        roaring_bitmap_printf_describe(prVar2);
        return _Var6;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      prVar2 = rnorun[uVar4 - 1];
      bitmap1 = roaring_bitmap_copy(rnorun[uVar4 - 2]);
      roaring_bitmap_and_inplace(bitmap1,prVar2);
      _Var1 = is_intersection_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no run intersection incorrect";
        goto LAB_00103335;
      }
      _Var1 = is_intersect_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no run intersect incorrect";
        goto LAB_00103335;
      }
      x2 = rruns[uVar4 - 1];
      prVar2 = roaring_bitmap_copy(rruns[uVar4 - 2]);
      roaring_bitmap_and_inplace(prVar2,x2);
      _Var1 = is_intersection_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] runs intersection incorrect";
        goto LAB_00103335;
      }
      _Var1 = is_intersect_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] runs intersect incorrect";
        goto LAB_00103335;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Intersections don\'t agree! (slow) ";
        goto LAB_00103335;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Intersections don\'t agree!";
        goto LAB_0010335a;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      _Var6 = count <= uVar4;
      lVar3 = (1 - count) + uVar4;
      uVar4 = uVar4 + 1;
    } while (lVar3 != 1);
  }
  return true;
}

Assistant:

bool compare_intersections(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                           size_t count) {
    roaring_bitmap_t *tempandnorun;
    roaring_bitmap_t *tempandruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempandnorun = roaring_bitmap_and(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersect incorrect\n");
            return false;
        }
        tempandruns = roaring_bitmap_and(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);

        tempandnorun = inplace_intersection(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersect incorrect\n");
            return false;
        }
        tempandruns = inplace_intersection(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);
    }
    return true;
}